

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_433838::SpotController::flush_regionprofile
          (SpotController *this,Caliper *c,CaliWriter *writer,Comm *comm)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ChannelBody *chB;
  reference this_00;
  Node *node;
  AggregationOp *extraout_RDX;
  AggregationOp *op_00;
  undefined1 auVar4 [16];
  anon_class_32_2_31f4f1ea local_328;
  SnapshotProcessFn local_308;
  undefined1 auStack_2e8 [8];
  Entry entry;
  Variant v_data;
  AggregationOp *op;
  iterator __end3;
  iterator __begin3;
  vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_> *__range3;
  string local_278;
  undefined1 local_258 [8];
  string query;
  char *q_local;
  Aggregator output_agg;
  QuerySpec output_spec;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string cross_query;
  char *q_cross;
  Comm *comm_local;
  CaliWriter *writer_local;
  Caliper *c_local;
  SpotController *this_local;
  
  cross_query.field_2._8_8_ = anon_var_dwarf_434073;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             " select *,min(inclusive#sum#time.duration) as \"Min time/rank\" unit sec,max(inclusive#sum#time.duration) as \"Max time/rank\" unit sec,avg(inclusive#sum#time.duration) as \"Avg time/rank\" unit sec,sum(inclusive#sum#time.duration) as \"Total time\"    unit sec group by path "
             ,&local_71);
  cali::ConfigManager::Options::build_query((string *)local_50,&this->m_opts,"cross",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  parse_spec((QuerySpec *)
             &output_agg.mP.
              super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pcVar3);
  cali::Aggregator::Aggregator
            ((Aggregator *)&q_local,
             (QuerySpec *)
             &output_agg.mP.
              super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cali::CaliperMetadataDB::add_attribute_aliases
            (&this->m_db,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&output_spec.format.kwargs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cali::CaliperMetadataDB::add_attribute_units
            (&this->m_db,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&output_spec.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count);
  query.field_2._8_8_ = anon_var_dwarf_43409a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             " let sum#time.duration=scale(sum#time.duration.ns,1e-9) select inclusive_sum(sum#time.duration) group by path "
             ,(allocator<char> *)((long)&__range3 + 7));
  cali::ConfigManager::Options::build_query((string *)local_258,&this->m_opts,"local",&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  chB = cali::ChannelController::channel_body((ChannelController *)this);
  local_aggregate(pcVar3,c,chB,&this->m_db,(Aggregator *)&q_local);
  std::__cxx11::string::~string((string *)local_258);
  (*comm->_vptr_Comm[5])(comm,&this->m_db,&q_local);
  iVar2 = (*comm->_vptr_Comm[2])();
  if (iVar2 == 0) {
    std::__cxx11::string::clear();
    __end3 = std::
             vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
             ::begin((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                      *)&output_spec);
    op = (AggregationOp *)
         std::
         vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
         end((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
              *)&output_spec);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<cali::QuerySpec::AggregationOp_*,_std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>_>
                                  *)&op);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<cali::QuerySpec::AggregationOp_*,_std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>_>
                ::operator*(&__end3);
      auVar4 = std::__cxx11::string::empty();
      op_00 = auVar4._8_8_;
      if ((auVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::append((char *)&this->m_spot_metrics);
        op_00 = extraout_RDX;
      }
      cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                ((string *)&v_data.m_v.value,(Aggregator *)this_00,op_00);
      std::__cxx11::string::append((string *)&this->m_spot_metrics);
      std::__cxx11::string::~string((string *)&v_data.m_v.value.v_bool);
      __gnu_cxx::
      __normal_iterator<cali::QuerySpec::AggregationOp_*,_std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>_>
      ::operator++(&__end3);
    }
    cali::Variant::Variant((Variant *)&entry.m_value.m_v.value,"regionprofile");
    node = cali::CaliperMetadataDB::make_tree_entry
                     (&this->m_db,1,&this->m_channel_attr,(Variant *)&entry.m_value.m_v.value,
                      (Node *)0x0);
    cali::Entry::Entry((Entry *)auStack_2e8,node);
    local_328.entry.m_value.m_v.value.v_uint = entry.m_value.m_v.type_and_size;
    local_328.entry.m_node = (Node *)auStack_2e8;
    local_328.entry.m_value.m_v.type_and_size = (uint64_t)entry.m_node;
    local_328.writer = writer;
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::
    function<(anonymous_namespace)::SpotController::flush_regionprofile(cali::Caliper&,cali::CaliWriter&,cali::internal::CustomOutputController::Comm&)::_lambda(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)_1_,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)&local_308,&local_328);
    cali::Aggregator::flush
              ((Aggregator *)&q_local,&(this->m_db).super_CaliperMetadataAccessInterface,&local_308)
    ;
    std::
    function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
    ::~function(&local_308);
  }
  cali::Aggregator::~Aggregator((Aggregator *)&q_local);
  cali::QuerySpec::~QuerySpec
            ((QuerySpec *)
             &output_agg.mP.
              super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void flush_regionprofile(Caliper& c, CaliWriter& writer, Comm& comm)
    {
        // --- Setup output reduction aggregator (final cross-process aggregation)
        const char* q_cross =
            " select *"
            ",min(inclusive#sum#time.duration) as \"Min time/rank\" unit sec"
            ",max(inclusive#sum#time.duration) as \"Max time/rank\" unit sec"
            ",avg(inclusive#sum#time.duration) as \"Avg time/rank\" unit sec"
            ",sum(inclusive#sum#time.duration) as \"Total time\"    unit sec"
            " group by path ";

        std::string cross_query = m_opts.build_query("cross", q_cross);

        QuerySpec  output_spec(parse_spec(cross_query.c_str()));
        Aggregator output_agg(output_spec);

        m_db.add_attribute_aliases(output_spec.aliases);
        m_db.add_attribute_units(output_spec.units);

        // ---   Flush Caliper buffers into intermediate aggregator to calculate
        //     region profile inclusive times
        {
            const char* q_local =
                " let sum#time.duration=scale(sum#time.duration.ns,1e-9)"
                " select inclusive_sum(sum#time.duration)"
                " group by path ";

            std::string query = m_opts.build_query("local", q_local);
            local_aggregate(query.c_str(), c, channel_body(), m_db, output_agg);
        }

        // --- Calculate min/max/avg times across MPI ranks
        comm.cross_aggregate(m_db, output_agg);

        if (comm.rank() == 0) {
            // --- Save the spot metrics
            m_spot_metrics.clear();

            for (const auto& op : output_spec.aggregate.list) {
                if (!m_spot_metrics.empty())
                    m_spot_metrics.append(",");

                m_spot_metrics.append(Aggregator::get_aggregation_attribute_name(op));
            }

            Variant v_data("regionprofile");
            Entry   entry(m_db.make_tree_entry(1, &m_channel_attr, &v_data));

            // --- Write region profile
            output_agg.flush(
                m_db,
                [&writer, entry](CaliperMetadataAccessInterface& in_db, const std::vector<Entry>& rec) {
                    writer.write_snapshot(in_db, augment_vector(rec, { entry }));
                }
            );
        }
    }